

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5WriteFlushBtree(Fts5Index *p,Fts5SegWriter *pWriter)

{
  Fts5DlidxWriter *pFVar1;
  Vdbe *p_00;
  sqlite3_mutex *psVar2;
  int iVar3;
  u8 *zData;
  long lVar4;
  Vdbe *p_1;
  long lVar5;
  long lVar6;
  uint local_34;
  
  if (pWriter->iBtPage != 0) {
    if ((pWriter->aDlidx->buf).n < 1) {
      local_34 = 0;
    }
    else {
      local_34 = (uint)(3 < pWriter->nEmpty);
    }
    if (0 < pWriter->nDlidx) {
      lVar6 = 0x1000000000;
      lVar4 = 0x18;
      lVar5 = 0;
      do {
        pFVar1 = pWriter->aDlidx;
        iVar3 = *(int *)((long)&pFVar1->pgno + lVar4);
        if (iVar3 == 0) break;
        if (local_34 != 0) {
          fts5DataWrite(p,((ulong)(uint)pWriter->iSegid << 0x25) + lVar6 +
                          (long)*(int *)((long)pFVar1 + lVar4 + -0x18),
                        *(u8 **)((long)pFVar1 + lVar4 + -8),iVar3);
        }
        *(undefined4 *)((long)&pFVar1->pgno + lVar4) = 0;
        *(undefined4 *)((long)pFVar1 + lVar4 + -0x14) = 0;
        lVar5 = lVar5 + 1;
        lVar6 = lVar6 + 0x80000000;
        lVar4 = lVar4 + 0x20;
      } while (lVar5 < pWriter->nDlidx);
    }
    pWriter->nEmpty = 0;
    if (p->rc == 0) {
      iVar3 = (pWriter->btterm).n;
      if (iVar3 < 1) {
        zData = "";
      }
      else {
        zData = (pWriter->btterm).p;
      }
      bindText(p->pIdxWriter,2,zData,iVar3,(_func_void_void_ptr *)0x0,'\0');
      sqlite3_bind_int64(p->pIdxWriter,3,(ulong)local_34 + (long)pWriter->iBtPage * 2);
      sqlite3_step(p->pIdxWriter);
      iVar3 = sqlite3_reset(p->pIdxWriter);
      p->rc = iVar3;
      p_00 = (Vdbe *)p->pIdxWriter;
      iVar3 = vdbeUnbind(p_00,2);
      if ((iVar3 == 0) && (psVar2 = p_00->db->mutex, psVar2 != (sqlite3_mutex *)0x0)) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar2);
      }
    }
    pWriter->iBtPage = 0;
  }
  return;
}

Assistant:

static void fts5WriteFlushBtree(Fts5Index *p, Fts5SegWriter *pWriter){
  int bFlag;

  assert( pWriter->iBtPage || pWriter->nEmpty==0 );
  if( pWriter->iBtPage==0 ) return;
  bFlag = fts5WriteFlushDlidx(p, pWriter);

  if( p->rc==SQLITE_OK ){
    const char *z = (pWriter->btterm.n>0?(const char*)pWriter->btterm.p:"");
    /* The following was already done in fts5WriteInit(): */
    /* sqlite3_bind_int(p->pIdxWriter, 1, pWriter->iSegid); */
    sqlite3_bind_blob(p->pIdxWriter, 2, z, pWriter->btterm.n, SQLITE_STATIC);
    sqlite3_bind_int64(p->pIdxWriter, 3, bFlag + ((i64)pWriter->iBtPage<<1));
    sqlite3_step(p->pIdxWriter);
    p->rc = sqlite3_reset(p->pIdxWriter);
    sqlite3_bind_null(p->pIdxWriter, 2);
  }
  pWriter->iBtPage = 0;
}